

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult GenValidUsageNextXrGetPlaneDetectionStateEXT
                   (XrPlaneDetectorEXT planeDetector,XrPlaneDetectionStateEXT *state)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  
  pVar2 = HandleInfo<XrPlaneDetectorEXT_T_*>::getWithInstanceInfo
                    (&g_planedetectorext_info,planeDetector);
  XVar1 = (*(pVar2.second)->dispatch_table->GetPlaneDetectionStateEXT)(planeDetector,state);
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrGetPlaneDetectionStateEXT(
    XrPlaneDetectorEXT planeDetector,
    XrPlaneDetectionStateEXT* state) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_planedetectorext_info.getWithInstanceInfo(planeDetector);
        GenValidUsageXrHandleInfo *gen_planedetectorext_info = info_with_instance.first;
        (void)gen_planedetectorext_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->GetPlaneDetectionStateEXT(planeDetector, state);
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}